

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

void BinarySink_put_padding(BinarySink *bs,size_t len,uchar padbyte)

{
  size_t local_48;
  size_t thislen;
  char buf [16];
  size_t sStack_18;
  uchar padbyte_local;
  size_t len_local;
  BinarySink *bs_local;
  
  memset(&thislen,(uint)padbyte,0x10);
  for (sStack_18 = len; sStack_18 != 0; sStack_18 = sStack_18 - local_48) {
    if (sStack_18 < 0x10) {
      local_48 = sStack_18;
    }
    else {
      local_48 = 0x10;
    }
    (*bs->write)(bs,&thislen,local_48);
  }
  return;
}

Assistant:

void BinarySink_put_padding(BinarySink *bs, size_t len, unsigned char padbyte)
{
    char buf[16];
    memset(buf, padbyte, sizeof(buf));
    while (len > 0) {
        size_t thislen = len < sizeof(buf) ? len : sizeof(buf);
        bs->write(bs, buf, thislen);
        len -= thislen;
    }
}